

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O0

bool __thiscall GPIO::DigitalIn::debounce(DigitalIn *this)

{
  strong_ordering sVar1;
  bool bVar2;
  ssize_t sVar3;
  rep rVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> *__lhs;
  byte bVar5;
  size_t in_RCX;
  size_t __nbytes;
  void *in_RDX;
  void *__buf;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  duration<long,_std::ratio<1L,_1000000000L>_> *unaff_retaddr;
  time_point now;
  byte local_41;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar6;
  __unspec local_29;
  rep local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  sVar3 = GPIOBase::read((GPIOBase *)(in_RDI + 5),*(int *)((long)&(in_RDI->__d).__r + 4),in_RDX,
                         in_RCX);
  if ((char)in_RDI[1].__d.__r == '\x02') {
    uVar6 = CONCAT13((char)(in_RDI->__d).__r,(int3)in_stack_ffffffffffffffc4);
  }
  else {
    uVar6 = CONCAT13((char)(in_RDI->__d).__r,(int3)in_stack_ffffffffffffffc4) ^ 0xff000000;
  }
  bVar5 = (byte)(uVar6 >> 0x18) & 1;
  __nbytes = (size_t)bVar5;
  if (((byte)sVar3 & 1) == bVar5) {
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&in_RDI[2].__d);
    if (rVar4 == 0) {
      local_1 = true;
    }
    else {
      __lhs = (duration<long,_std::ratio<1L,_1000000000L>_> *)std::chrono::_V2::steady_clock::now();
      local_28 = (rep)std::chrono::operator-
                                (in_RDI,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
      sVar1 = std::chrono::
              operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                        (__lhs,(duration<long,_std::ratio<1L,_1000000000L>_> *)
                               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      std::__cmp_cat::__unspec::__unspec(&local_29,(__unspec *)0x0);
      bVar2 = std::operator<(sVar1._M_value);
      if (bVar2) {
        local_1 = false;
      }
      else {
        rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&in_RDI[3].__d);
        if (0 < rVar4) {
          std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(unaff_retaddr);
          sVar3 = GPIOBase::read((GPIOBase *)(in_RDI + 5),*(int *)((long)&(in_RDI->__d).__r + 4),
                                 __buf,__nbytes);
          if ((char)in_RDI[1].__d.__r == '\x02') {
            local_41 = (byte)(in_RDI->__d).__r;
          }
          else {
            local_41 = (byte)(in_RDI->__d).__r ^ 0xff;
          }
          if (((byte)sVar3 & 1) != (local_41 & 1)) {
            return false;
          }
        }
        in_RDI[4].__d.__r = (rep)__lhs;
        *(byte *)&(in_RDI->__d).__r = ((byte)(in_RDI->__d).__r ^ 0xff) & 1;
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DigitalIn::debounce()
{
    // check if the input has the expected state

    if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    
    // is this a truly perfect digital 0 1 input? Then do not debounce..

    if (m_min_trigger_interval.count() == 0) return true;
    
    auto now = std::chrono::steady_clock::now();
    if ((now - m_last_triggered) < m_min_trigger_interval) return false;

    if (m_min_hold_interval.count() > 0) {

        // sleep a wink

        std::this_thread::sleep_for(m_min_hold_interval);
    
        // and check if the pin is still triggered (pin is 0 if pulldown and switch closed, otherwise 1

        if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    }
    
    // finally assign this event as the last trigger

    m_last_triggered = now;
    
    // toggle state

    m_state = !m_state;
    
    // and return success

    return true;
}